

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

FunctionEntryPointInfo * __thiscall Js::FunctionBody::CreateNewDefaultEntryPoint(FunctionBody *this)

{
  Type pSVar1;
  PVOID dynamicInterpreterThunk;
  ExecutionMode EVar2;
  Recycler *alloc;
  FunctionEntryPointInfo *this_00;
  EntryPointInfo *this_01;
  code *originalEntryPoint;
  JavascriptMethod method;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  pSVar1 = (this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext;
  method = pSVar1->CurrentThunk;
  local_50 = (undefined1  [8])&FunctionEntryPointInfo::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2ab02c8;
  data.filename._0_4_ = 0x1af5;
  alloc = Memory::Recycler::TrackAllocInfo(pSVar1->recycler,(TrackAllocData *)local_50);
  this_00 = (FunctionEntryPointInfo *)new<Memory::Recycler>(0x88,alloc,0x39e810);
  FunctionEntryPointInfo::FunctionEntryPointInfo
            (this_00,(FunctionProxy *)this,method,
             ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
             threadContext);
  AddEntryPointToEntryPointList(this,this_00);
  AutoFilterExceptionRegion::AutoFilterExceptionRegion
            ((AutoFilterExceptionRegion *)local_50,ExceptionType_All);
  this_01 = (EntryPointInfo *)
            FunctionProxy::GetAuxPtr((FunctionProxy *)this,SimpleJitEntryPointInfo);
  if (this_01 != (EntryPointInfo *)0x0) {
    EVar2 = FunctionExecutionStateMachine::GetExecutionMode(&this->executionState);
    if (EVar2 == FullJit) {
      originalEntryPoint = EntryPointInfo::GetNativeEntrypoint(this_01);
      method = originalEntryPoint;
      goto LAB_0076a7b1;
    }
  }
  dynamicInterpreterThunk = (this->super_ParseableFunctionInfo).m_dynamicInterpreterThunk;
  if (dynamicInterpreterThunk == (PVOID)0x0) {
    originalEntryPoint = InterpreterStackFrame::DelayDynamicInterpreterThunk;
  }
  else {
    originalEntryPoint =
         (code *)InterpreterThunkEmitter::ConvertToEntryPoint(dynamicInterpreterThunk);
  }
  if (method == InterpreterStackFrame::DelayDynamicInterpreterThunk) {
    method = originalEntryPoint;
  }
LAB_0076a7b1:
  (this_00->super_EntryPointInfo).super_ProxyEntryPointInfo.jsMethod = (Type)method;
  SetDefaultFunctionEntryPointInfo(this,this_00,originalEntryPoint);
  AutoFilterExceptionRegion::~AutoFilterExceptionRegion((AutoFilterExceptionRegion *)local_50);
  return this_00;
}

Assistant:

FunctionEntryPointInfo* FunctionBody::CreateNewDefaultEntryPoint()
    {
        Recycler *const recycler = this->m_scriptContext->GetRecycler();
        const JavascriptMethod currentThunk = m_scriptContext->CurrentThunk;

        FunctionEntryPointInfo *const entryPointInfo =
            RecyclerNewFinalized(
                recycler,
                FunctionEntryPointInfo,
                this,
                currentThunk,
                m_scriptContext->GetThreadContext());

        AddEntryPointToEntryPointList(entryPointInfo);

        {
            // Allocations in this region may trigger expiry and cause unexpected changes to state
            AUTO_NO_EXCEPTION_REGION;

            Js::JavascriptMethod originalEntryPoint, directEntryPoint;

#if ENABLE_NATIVE_CODEGEN
            FunctionEntryPointInfo *const simpleJitEntryPointInfo = GetSimpleJitEntryPointInfo();
            if(simpleJitEntryPointInfo && GetExecutionMode() == ExecutionMode::FullJit)
            {
                directEntryPoint =
                    originalEntryPoint = simpleJitEntryPointInfo->GetNativeEntrypoint();
            }
            else
#endif
            {
#if DYNAMIC_INTERPRETER_THUNK
                // If the dynamic interpreter thunk hasn't been created yet, then the entry point can be set to
                // the default entry point. Otherwise, since the new default entry point is being created to
                // move back to the interpreter, the original entry point is going to be the dynamic interpreter thunk
                originalEntryPoint =
                    m_dynamicInterpreterThunk
                        ? reinterpret_cast<JavascriptMethod>(InterpreterThunkEmitter::ConvertToEntryPoint(m_dynamicInterpreterThunk))
                        : DefaultEntryThunk;
#else
                originalEntryPoint = DefaultEntryThunk;
#endif

                directEntryPoint = currentThunk == DefaultEntryThunk ? originalEntryPoint : currentThunk;
            }

            entryPointInfo->jsMethod = directEntryPoint;
            SetDefaultFunctionEntryPointInfo(entryPointInfo, originalEntryPoint);
        }

        return entryPointInfo;
    }